

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

bool __thiscall
brotli::HashLongestMatch<14,_4,_4>::FindLongestMatch
          (HashLongestMatch<14,_4,_4> *this,uint8_t *data,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  int *piVar10;
  size_t i;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  *best_len_code_out = 0;
  uVar24 = cur_ix & ring_buffer_mask;
  dVar26 = *best_score_out;
  uVar7 = *best_len_out;
  *best_len_out = 0;
  uVar15 = max_length & 0xfffffffffffffff8;
  uVar18 = (ulong)((uint)max_length & 7);
  piVar1 = (int *)(data + uVar24);
  bVar22 = false;
  uVar11 = 0;
  do {
    uVar21 = (long)(int)(&kDistanceCacheOffset)[uVar11] +
             (long)distance_cache[(uint)(&kDistanceCacheIndex)[uVar11]];
    if ((uVar21 <= max_backward && cur_ix - uVar21 < cur_ix) && (uVar7 + uVar24 <= ring_buffer_mask)
       ) {
      uVar23 = cur_ix - uVar21 & ring_buffer_mask;
      if ((uVar23 + uVar7 <= ring_buffer_mask) && (data[uVar7 + uVar24] == data[uVar23 + uVar7])) {
        if (7 < max_length) {
          lVar12 = 0;
          uVar16 = 0;
LAB_00121147:
          if (*(ulong *)(piVar1 + uVar16 * 2) == *(ulong *)(data + uVar16 * 8 + uVar23))
          goto code_r0x00121159;
          uVar16 = *(ulong *)(data + uVar16 * 8 + uVar23) ^ *(ulong *)(piVar1 + uVar16 * 2);
          uVar23 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar16 = (uVar23 >> 3 & 0x1fffffff) - lVar12;
          goto LAB_0012118e;
        }
        piVar10 = piVar1;
        uVar17 = 0;
LAB_00121216:
        uVar16 = uVar17;
        if (uVar18 != 0) {
          uVar19 = uVar17 | uVar18;
          uVar13 = uVar18;
          do {
            uVar16 = uVar17;
            if (data[uVar17 + uVar23] != (uint8_t)*piVar10) break;
            piVar10 = (int *)((long)piVar10 + 1);
            uVar17 = uVar17 + 1;
            uVar13 = uVar13 - 1;
            uVar16 = uVar19;
          } while (uVar13 != 0);
        }
LAB_0012118e:
        if (((2 < uVar16) || ((uVar11 < 2 && (uVar16 == 2)))) &&
           (auVar28._8_4_ = (int)(uVar16 >> 0x20), auVar28._0_8_ = uVar16,
           auVar28._12_4_ = 0x45300000,
           dVar27 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) * 5.4 -
                    (double)(&BackwardReferenceScoreUsingLastDistance(unsigned_long,unsigned_long)::
                              kDistanceShortCodeBitCost)[uVar11], dVar26 < dVar27)) {
          *best_len_out = uVar16;
          *best_len_code_out = uVar16;
          *best_distance_out = uVar21;
          *best_score_out = dVar27;
          bVar22 = true;
          uVar7 = uVar16;
          dVar26 = dVar27;
        }
      }
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  uVar14 = (uint)(*piVar1 * 0x1e35a7bd) >> 0x12;
  uVar2 = this->num_[uVar14];
  uVar21 = (ulong)uVar2;
  uVar11 = 0;
  if (0x10 < uVar2) {
    uVar11 = (ulong)(uVar2 - 0x10);
  }
  if (uVar11 < uVar21) {
    do {
      uVar21 = uVar21 - 1;
      uVar3 = *(uint *)((long)this->buckets_[0] +
                       (ulong)((uint)uVar21 & 0xf) * 4 + (ulong)(uVar14 << 6));
      uVar23 = cur_ix - uVar3;
      if ((uVar23 == 0) || (max_backward < uVar23)) break;
      if (uVar7 + uVar24 <= ring_buffer_mask) {
        uVar16 = (ulong)(uVar3 & (uint)ring_buffer_mask);
        if ((uVar7 + uVar16 <= ring_buffer_mask) && (data[uVar7 + uVar24] == data[uVar7 + uVar16]))
        {
          if (7 < max_length) {
            lVar12 = 0;
            uVar17 = 0;
LAB_0012130d:
            if (*(ulong *)(piVar1 + uVar17 * 2) == *(ulong *)(data + uVar17 * 8 + uVar16))
            goto code_r0x00121320;
            uVar17 = *(ulong *)(data + uVar17 * 8 + uVar16) ^ *(ulong *)(piVar1 + uVar17 * 2);
            uVar16 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar17 = (uVar16 >> 3 & 0x1fffffff) - lVar12;
            goto LAB_00121354;
          }
          piVar10 = piVar1;
          uVar13 = 0;
LAB_001213ce:
          uVar17 = uVar13;
          if (uVar18 != 0) {
            uVar20 = uVar13 | uVar18;
            uVar19 = uVar18;
            do {
              uVar17 = uVar13;
              if (data[uVar13 + uVar16] != (uint8_t)*piVar10) break;
              piVar10 = (int *)((long)piVar10 + 1);
              uVar13 = uVar13 + 1;
              uVar19 = uVar19 - 1;
              uVar17 = uVar20;
            } while (uVar19 != 0);
          }
LAB_00121354:
          if (3 < uVar17) {
            auVar29._8_4_ = (int)(uVar17 >> 0x20);
            auVar29._0_8_ = uVar17;
            auVar29._12_4_ = 0x45300000;
            iVar4 = 0x1f;
            if ((uint)uVar23 != 0) {
              for (; (uint)uVar23 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            dVar27 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0)) * 5.4 +
                     (double)iVar4 * -1.2;
            if (dVar26 < dVar27) {
              *best_len_out = uVar17;
              *best_len_code_out = uVar17;
              *best_distance_out = uVar23;
              *best_score_out = dVar27;
              bVar22 = true;
              uVar7 = uVar17;
              dVar26 = dVar27;
            }
          }
        }
      }
    } while (uVar11 < uVar21);
  }
  *(int *)((long)this->buckets_[0] + (ulong)(uVar2 & 0xf) * 4 + (ulong)(uVar14 << 6)) = (int)cur_ix;
  this->num_[uVar14] = uVar2 + 1;
  bVar6 = true;
  if (!bVar22) {
    uVar7 = this->num_dict_lookups_;
    uVar11 = this->num_dict_matches_;
    if (uVar11 < uVar7 >> 7) {
      bVar6 = false;
    }
    else {
      uVar15 = (ulong)(uVar14 * 2);
      bVar5 = true;
      bVar6 = bVar22;
      do {
        bVar22 = bVar5;
        uVar7 = uVar7 + 1;
        this->num_dict_lookups_ = uVar7;
        uVar2 = *(ushort *)(kStaticDictionaryHash + uVar15 * 2);
        if (uVar2 != 0) {
          uVar14 = uVar2 & 0x1f;
          uVar18 = (ulong)uVar14;
          if (uVar18 <= max_length) {
            puVar8 = kBrotliDictionary +
                     uVar18 * (uVar2 >> 5) + (ulong)kBrotliDictionaryOffsetsByLength[uVar18];
            if (7 < uVar14) {
              uVar21 = (ulong)(uVar2 & 0x18);
              puVar9 = puVar8 + uVar21;
              uVar24 = 0;
LAB_001214f3:
              if (*(ulong *)(puVar8 + uVar24) == *(ulong *)((long)piVar1 + uVar24))
              goto code_r0x00121505;
              uVar23 = *(ulong *)((long)piVar1 + uVar24) ^ *(ulong *)(puVar8 + uVar24);
              uVar21 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar24 = (uVar21 >> 3 & 0x1fffffff) + uVar24;
              goto LAB_0012152e;
            }
            uVar21 = 0;
            puVar9 = puVar8;
LAB_001215e8:
            uVar23 = uVar18 & 7;
            uVar24 = uVar21;
            if ((uVar2 & 7) != 0) {
              uVar16 = uVar21 | uVar23;
              do {
                uVar24 = uVar21;
                if (*(uint8_t *)((long)piVar1 + uVar21) != *puVar9) break;
                puVar9 = puVar9 + 1;
                uVar21 = uVar21 + 1;
                uVar23 = uVar23 - 1;
                uVar24 = uVar16;
              } while (uVar23 != 0);
            }
LAB_0012152e:
            if ((uVar24 != 0) && (uVar18 < uVar24 + 10)) {
              sVar25 = (ulong)(uVar2 >> 5) + max_backward + 1 +
                       (long)(1 << (""[uVar18] & 0x1f)) *
                       (ulong)(byte)kCutoffTransforms[uVar18 - uVar24];
              auVar30._8_4_ = (int)(uVar24 >> 0x20);
              auVar30._0_8_ = uVar24;
              auVar30._12_4_ = 0x45300000;
              iVar4 = 0x1f;
              uVar14 = (uint)sVar25;
              if (uVar14 != 0) {
                for (; uVar14 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              dVar27 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0)) * 5.4 +
                       (double)iVar4 * -1.2;
              if (dVar26 < dVar27) {
                uVar11 = uVar11 + 1;
                this->num_dict_matches_ = uVar11;
                *best_len_out = uVar24;
                *best_len_code_out = uVar18;
                *best_distance_out = sVar25;
                *best_score_out = dVar27;
                bVar6 = true;
                dVar26 = dVar27;
              }
            }
          }
        }
        uVar15 = uVar15 + 1;
        bVar5 = false;
      } while (bVar22);
    }
  }
  return bVar6;
code_r0x00121159:
  uVar16 = uVar16 + 1;
  lVar12 = lVar12 + -8;
  piVar10 = (int *)((long)piVar1 + uVar15);
  uVar17 = uVar15;
  if (max_length >> 3 == uVar16) goto LAB_00121216;
  goto LAB_00121147;
code_r0x00121320:
  uVar17 = uVar17 + 1;
  lVar12 = lVar12 + -8;
  piVar10 = (int *)((long)piVar1 + uVar15);
  uVar13 = uVar15;
  if (max_length >> 3 == uVar17) goto LAB_001213ce;
  goto LAB_0012130d;
code_r0x00121505:
  uVar24 = uVar24 + 8;
  if (uVar21 == uVar24) goto LAB_001215e8;
  goto LAB_001214f3;
}

Assistant:

bool FindLongestMatch(const uint8_t * __restrict data,
                        const size_t ring_buffer_mask,
                        const int* __restrict distance_cache,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        size_t * __restrict best_len_out,
                        size_t * __restrict best_len_code_out,
                        size_t * __restrict best_distance_out,
                        double * __restrict best_score_out) {
    *best_len_code_out = 0;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    bool match_found = false;
    // Don't accept a short copy from far away.
    double best_score = *best_score_out;
    size_t best_len = *best_len_out;
    *best_len_out = 0;
    // Try last distance first.
    for (size_t i = 0; i < kNumLastDistancesToCheck; ++i) {
      const size_t idx = kDistanceCacheIndex[i];
      const size_t backward =
          static_cast<size_t>(distance_cache[idx] + kDistanceCacheOffset[i]);
      size_t prev_ix = static_cast<size_t>(cur_ix - backward);
      if (prev_ix >= cur_ix) {
        continue;
      }
      if (PREDICT_FALSE(backward > max_backward)) {
        continue;
      }
      prev_ix &= ring_buffer_mask;

      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 3 || (len == 2 && i < 2)) {
        // Comparing for >= 2 does not change the semantics, but just saves for
        // a few unnecessary binary logarithms in backward reference score,
        // since we are not interested in such short matches.
        double score = BackwardReferenceScoreUsingLastDistance(len, i);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    const uint32_t * __restrict const bucket = &buckets_[key][0];
    const size_t down = (num_[key] > kBlockSize) ? (num_[key] - kBlockSize) : 0;
    for (size_t i = num_[key]; i > down;) {
      --i;
      size_t prev_ix = bucket[i & kBlockMask];
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        // Comparing for >= 3 does not change the semantics, but just saves
        // for a few unnecessary binary logarithms in backward reference
        // score, since we are not interested in such short matches.
        double score = BackwardReferenceScore(len, backward);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    buckets_[key][num_[key] & kBlockMask] = static_cast<uint32_t>(cur_ix);
    ++num_[key];
    if (!match_found && num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      size_t dict_key = Hash<14>(&data[cur_ix_masked]) << 1;
      for (int k = 0; k < 2; ++k, ++dict_key) {
        ++num_dict_lookups_;
        const uint16_t v = kStaticDictionaryHash[dict_key];
        if (v > 0) {
          const size_t len = v & 31;
          const size_t dist = v >> 5;
          const size_t offset =
              kBrotliDictionaryOffsetsByLength[len] + len * dist;
          if (len <= max_length) {
            const size_t matchlen =
                FindMatchLengthWithLimit(&data[cur_ix_masked],
                                         &kBrotliDictionary[offset], len);
            if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
              const size_t transform_id = kCutoffTransforms[len - matchlen];
              const size_t word_id =
                  transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                  dist;
              const size_t backward = max_backward + word_id + 1;
              double score = BackwardReferenceScore(matchlen, backward);
              if (best_score < score) {
                ++num_dict_matches_;
                best_score = score;
                best_len = matchlen;
                *best_len_out = best_len;
                *best_len_code_out = len;
                *best_distance_out = backward;
                *best_score_out = best_score;
                match_found = true;
              }
            }
          }
        }
      }
    }
    return match_found;
  }